

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libfsst.cpp
# Opt level: O2

size_t fsst_compress(fsst_encoder_t *encoder,size_t nlines,size_t *lenIn,u8 **strIn,size_t size,
                    u8 *output,size_t *lenOut,u8 **strOut)

{
  int simd;
  size_t sVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  
  uVar3 = 0;
  for (lVar4 = 0; nlines * 8 - lVar4 != 0; lVar4 = lVar4 + 8) {
    uVar3 = uVar3 + *(int *)((long)lenIn + lVar4);
  }
  iVar2 = 3;
  if (nlines < 0x41) {
    iVar2 = (uint)(0x8000 < uVar3) * 3;
  }
  simd = 0;
  if (nlines * 0xc < (ulong)(long)(int)uVar3) {
    simd = iVar2;
  }
  sVar1 = libfsst::_compressAuto
                    ((Encoder *)encoder,nlines,lenIn,strIn,size,output,lenOut,strOut,simd);
  return sVar1;
}

Assistant:

size_t fsst_compress(fsst_encoder_t *encoder, size_t nlines, const size_t lenIn[], const u8 *strIn[], size_t size, u8 *output, size_t *lenOut, u8 *strOut[]) {
   // to be faster than scalar, simd needs 64 lines or more of length >=12; or fewer lines, but big ones (totLen > 32KB)
   size_t totLen = accumulate(lenIn, lenIn+nlines, 0);
   int simd = totLen > nlines*12 && (nlines > 64 || totLen > (size_t) 1<<15); 
   return _compressAuto((Encoder*) encoder, nlines, lenIn, strIn, size, output, lenOut, strOut, 3*simd);
}